

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O3

int handle_add_dirafter(dmr_C *C,stream *stream,token **line,token *token)

{
  position pos;
  char **ppcVar1;
  position pVar2;
  char **ppcVar3;
  
  pVar2 = (position)token->next;
  if (pVar2 != (position)&dmrC_eof_token_entry_) {
    do {
      pos = *(position *)pVar2;
      if ((pos._0_4_ & 0x3f) != 0xf) {
        dmrC_sparse_error(C,pos,"expected path string");
        return 1;
      }
      if (C->includepath[0x12a] != (char *)0x0) {
        dmrC_error_die(C,pos,"too many include path entries");
      }
      ppcVar1 = C->includepath;
      do {
        ppcVar3 = ppcVar1;
        ppcVar1 = ppcVar3 + 1;
      } while (*ppcVar3 != (char *)0x0);
      *ppcVar3 = (char *)((long)*(position *)((long)pVar2 + 0x10) + 4);
      ppcVar3[1] = (char *)0x0;
      pVar2 = *(position *)((long)pVar2 + 8);
    } while (pVar2 != (position)&dmrC_eof_token_entry_);
  }
  return 1;
}

Assistant:

static int handle_add_dirafter(struct dmr_C *C, struct stream *stream, struct token **line, struct token *token)
{
        (void) line;
        (void) stream;
	for (;;) {
		token = token->next;
		if (dmrC_eof_token(token))
			return 1;
		if (dmrC_token_type(token) != TOKEN_STRING) {
			dmrC_sparse_error(C, token->pos, "expected path string");
			return 1;
		}
		add_dirafter_entry(C, token, token->string->data);
	}
}